

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Function.h
# Opt level: O2

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
slang::function_ref<std::__cxx11::string()>::
callback_fn<slang::syntax::SyntaxTree::create(slang::SourceManager&,nonstd::span_lite::span<slang::SourceBuffer_const,18446744073709551615ul>,slang::Bag_const&,nonstd::span_lite::span<slang::syntax::DefineDirectiveSyntax_const*const,18446744073709551615ul>,bool)::__0>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,function_ref<std::__cxx11::string()> *this,intptr_t callable)

{
  SourceManager *this_00;
  reference pSVar1;
  allocator<char> local_21;
  string_view local_20;
  
  if ((*(span<const_slang::SourceBuffer,_18446744073709551615UL> **)this)->size_ == 1) {
    this_00 = *(SourceManager **)(this + 8);
    pSVar1 = nonstd::span_lite::span<const_slang::SourceBuffer,_18446744073709551615UL>::operator[]
                       (*(span<const_slang::SourceBuffer,_18446744073709551615UL> **)this,0);
    local_20 = SourceManager::getRawFileName(this_00,(BufferID)(pSVar1->id).id);
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              ((string *)__return_storage_ptr__,&local_20,&local_21);
  }
  else {
    s_abi_cxx11_(__return_storage_ptr__,"<multi-buffer>",0xe);
  }
  return __return_storage_ptr__;
}

Assistant:

static Ret callback_fn(intptr_t callable, Params... params) {
        return (*reinterpret_cast<Callable*>(callable))(std::forward<Params>(params)...);
    }